

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

char * testing::internal::CodePointToUtf8(UInt32 code_point,char *str)

{
  UInt32 UVar1;
  char *src;
  String local_28;
  byte *local_18;
  char *str_local;
  UInt32 code_point_local;
  
  local_18 = (byte *)str;
  if (code_point < 0x80) {
    str[1] = '\0';
    *str = (char)code_point;
  }
  else {
    str_local._4_4_ = code_point;
    if (code_point < 0x800) {
      str[2] = '\0';
      UVar1 = ChopLowBits((UInt32 *)((long)&str_local + 4),6);
      local_18[1] = (byte)UVar1 | 0x80;
      *local_18 = (byte)str_local._4_4_ | 0xc0;
    }
    else if (code_point < 0x10000) {
      str[3] = '\0';
      UVar1 = ChopLowBits((UInt32 *)((long)&str_local + 4),6);
      local_18[2] = (byte)UVar1 | 0x80;
      UVar1 = ChopLowBits((UInt32 *)((long)&str_local + 4),6);
      local_18[1] = (byte)UVar1 | 0x80;
      *local_18 = (byte)str_local._4_4_ | 0xe0;
    }
    else if (code_point < 0x200000) {
      str[4] = '\0';
      UVar1 = ChopLowBits((UInt32 *)((long)&str_local + 4),6);
      local_18[3] = (byte)UVar1 | 0x80;
      UVar1 = ChopLowBits((UInt32 *)((long)&str_local + 4),6);
      local_18[2] = (byte)UVar1 | 0x80;
      UVar1 = ChopLowBits((UInt32 *)((long)&str_local + 4),6);
      local_18[1] = (byte)UVar1 | 0x80;
      *local_18 = (byte)str_local._4_4_ | 0xf0;
    }
    else {
      String::Format(&local_28,"(Invalid Unicode 0x%X)",(ulong)code_point);
      src = String::c_str(&local_28);
      posix::StrNCpy(str,src,0x20);
      String::~String((String *)str);
      local_18[0x1f] = 0;
    }
  }
  return (char *)local_18;
}

Assistant:

char* CodePointToUtf8(UInt32 code_point, char* str) {
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else if (code_point <= kMaxCodePoint4) {
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  } else {
    // The longest string String::Format can produce when invoked
    // with these parameters is 28 character long (not including
    // the terminating nul character). We are asking for 32 character
    // buffer just in case. This is also enough for strncpy to
    // null-terminate the destination string.
    posix::StrNCpy(
        str, String::Format("(Invalid Unicode 0x%X)", code_point).c_str(), 32);
    str[31] = '\0';  // Makes sure no change in the format to strncpy leaves
                     // the result unterminated.
  }
  return str;
}